

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unqliteOsOpen(unqlite_vfs *pVfs,SyMemBackend *pAlloc,char *zPath,unqlite_file **ppOut,uint flags
                 )

{
  int iVar1;
  unqlite_file *pChunk;
  unqlite_file *puVar2;
  uint uVar3;
  unqlite_file *puVar4;
  unqlite_file *puVar5;
  
  *ppOut = (unqlite_file *)0x0;
  if (zPath == (char *)0x0) {
    iVar1 = -3;
  }
  else {
    pChunk = (unqlite_file *)SyMemBackendAlloc(pAlloc,pVfs->szOsFile + 8);
    if (pChunk == (unqlite_file *)0x0) {
      iVar1 = -1;
    }
    else {
      uVar3 = pVfs->szOsFile + 8;
      if (uVar3 != 0) {
        puVar2 = (unqlite_file *)((long)&pChunk->pMethods + (ulong)uVar3);
        puVar4 = pChunk;
        do {
          *(undefined1 *)&puVar4->pMethods = 0;
          puVar5 = (unqlite_file *)((long)&puVar4->pMethods + 1);
          if (puVar2 <= puVar5) break;
          *(undefined1 *)&puVar5->pMethods = 0;
          puVar5 = (unqlite_file *)((long)&puVar4->pMethods + 2);
          if (puVar2 <= puVar5) break;
          *(undefined1 *)&puVar5->pMethods = 0;
          puVar5 = (unqlite_file *)((long)&puVar4->pMethods + 3);
          if (puVar2 <= puVar5) break;
          *(undefined1 *)&puVar5->pMethods = 0;
          puVar4 = (unqlite_file *)((long)&puVar4->pMethods + 4);
        } while (puVar4 < puVar2);
      }
      iVar1 = (*pVfs->xOpen)(pVfs,zPath,pChunk,flags);
      if (iVar1 != 0) {
        SyMemBackendFree(pAlloc,pChunk);
        pChunk = (unqlite_file *)0x0;
      }
      *ppOut = pChunk;
    }
  }
  return iVar1;
}

Assistant:

UNQLITE_PRIVATE int unqliteOsOpen(
  unqlite_vfs *pVfs,
  SyMemBackend *pAlloc,
  const char *zPath, 
  unqlite_file **ppOut, 
  unsigned int flags 
)
{
	unqlite_file *pFile;
	int rc;
	*ppOut = 0;
	if( zPath == 0 ){
		/* May happen if dealing with an in-memory database */
		return SXERR_EMPTY;
	}
	/* Allocate a new instance */
	pFile = (unqlite_file *)SyMemBackendAlloc(pAlloc,sizeof(unqlite_file)+pVfs->szOsFile);
	if( pFile == 0 ){
		return UNQLITE_NOMEM;
	}
	/* Zero the structure */
	SyZero(pFile,sizeof(unqlite_file)+pVfs->szOsFile);
	/* Invoke the xOpen method of the underlying VFS */
	rc = pVfs->xOpen(pVfs, zPath, pFile, flags);
	if( rc != UNQLITE_OK ){
		SyMemBackendFree(pAlloc,pFile);
		pFile = 0;
	}
	*ppOut = pFile;
	return rc;
}